

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::learn_at_leaf_random
               (memory_tree *b,single_learner *base,uint32_t *leaf_id,example *ec,float *weight)

{
  long lVar1;
  node *pnVar2;
  size_t sVar3;
  uint *puVar4;
  example **ppeVar5;
  example *in_RCX;
  example *in_RDX;
  example *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  float fVar6;
  float score;
  uint32_t pos;
  float reward;
  int32_t ec_id;
  uint64_t *in_stack_ffffffffffffffa0;
  example *ec_00;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_30;
  uint local_2c;
  example *ec_01;
  
  *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
  local_2c = 0xffffffff;
  local_30 = 0;
  pnVar2 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(in_RDI + 8),
                      (ulong)*(uint *)&(in_RDX->super_example_predict).indices._begin);
  sVar3 = v_array<unsigned_int>::size(&pnVar2->examples_index);
  if (sVar3 != 0) {
    in_stack_ffffffffffffffb0 = merand48(in_stack_ffffffffffffffa0);
    pnVar2 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),
                        (ulong)*(uint *)&(in_RDX->super_example_predict).indices._begin);
    sVar3 = v_array<unsigned_int>::size(&pnVar2->examples_index);
    in_stack_ffffffffffffffb4 = (float)(long)sVar3;
    in_stack_ffffffffffffffb8 = (float)sVar3;
    fVar6 = in_stack_ffffffffffffffb0 * in_stack_ffffffffffffffb8;
    pnVar2 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),
                        (ulong)*(uint *)&(in_RDX->super_example_predict).indices._begin);
    puVar4 = v_array<unsigned_int>::operator[](&pnVar2->examples_index,(long)fVar6 & 0xffffffff);
    local_2c = *puVar4;
  }
  if (local_2c != 0xffffffff) {
    ppeVar5 = v_array<example_*>::operator[]
                        ((v_array<example_*> *)(in_RDI + 0x28),(long)(int)local_2c);
    if (((*ppeVar5)->l).multi.label == (in_RCX->l).multi.label) {
      local_30 = 0x3f800000;
    }
    ec_00 = in_RCX;
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(long)(int)local_2c);
    fVar6 = normalized_linear_prod
                      ((memory_tree *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (example *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (example *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    ec_01 = ec_00;
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(long)(int)local_2c);
    diag_kronecker_product_test(in_RSI,in_RDX,ec_01,(int)((ulong)in_R8 >> 0x20));
    lVar1 = *(long *)(in_RDI + 0xe0);
    *(ulong *)(lVar1 + 0x6828) = CONCAT44(0x3f800000,local_30);
    *(float *)(lVar1 + 0x6830) = -fVar6;
    *(undefined4 *)(*(long *)(in_RDI + 0xe0) + 0x6870) = *in_R8;
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),ec_00,(size_t)in_RCX);
  }
  return;
}

Assistant:

void learn_at_leaf_random(memory_tree& b, single_learner& base, const uint32_t& leaf_id, example& ec, const float& weight){
        b.total_num_queries ++;
        int32_t ec_id = -1;
        float reward = 0.f;
        if (b.nodes[leaf_id].examples_index.size() > 0){
            uint32_t pos = uint32_t(merand48(b.all->random_state) * b.nodes[leaf_id].examples_index.size());
			ec_id = b.nodes[leaf_id].examples_index[pos];
        }
        if (ec_id != -1){
            if (b.examples[ec_id]->l.multi.label == ec.l.multi.label)
                reward = 1.f;             
            float score = normalized_linear_prod(b, &ec, b.examples[ec_id]);
            diag_kronecker_product_test(ec, *b.examples[ec_id], *b.kprod_ec, b.oas);
         	b.kprod_ec->l.simple = {reward, 1.f, -score};
	    	b.kprod_ec->weight = weight; //* b.nodes[leaf_id].examples_index.size();
            base.learn(*b.kprod_ec, b.max_routers);
        }
        return;
    }